

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

void Curl_ssl_delsessionid(Curl_easy *data,void *ssl_sessionid)

{
  size_t sVar1;
  Curl_ssl_session *session;
  
  sVar1 = (data->set).general_ssl.max_ssl_sessions;
  if (sVar1 != 0) {
    session = (data->state).session;
    do {
      if (session->sessionid == ssl_sessionid) {
        Curl_ssl_kill_session(session);
        return;
      }
      session = session + 1;
      sVar1 = sVar1 - 1;
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void Curl_ssl_delsessionid(struct Curl_easy *data, void *ssl_sessionid)
{
  size_t i;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    struct Curl_ssl_session *check = &data->state.session[i];

    if(check->sessionid == ssl_sessionid) {
      Curl_ssl_kill_session(check);
      break;
    }
  }
}